

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  bool bVar1;
  string *output;
  unsigned_long i;
  unsigned_long i_00;
  protobuf *this_00;
  uint64 max_value;
  uint64 uVar2;
  string local_60;
  uint64 value_1;
  double value;
  LocationRecorder location;
  
  if ((field->_has_bits_[0] & 0x40) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Already set option \"default\".",(allocator<char> *)&location);
    AddError(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    FieldDescriptorProto::clear_default_value(field);
  }
  bVar1 = Consume(this,"default");
  if ((!bVar1) || (bVar1 = Consume(this,"="), !bVar1)) {
    return false;
  }
  LocationRecorder::LocationRecorder(&location,field_location,7);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,DEFAULT_VALUE);
  output = FieldDescriptorProto::mutable_default_value_abi_cxx11_(field);
  if ((field->_has_bits_[0] & 8) == 0) {
    bVar1 = ConsumeIdentifier(this,output,"Expected identifier.");
    goto LAB_001d1cf6;
  }
  switch(field->type_) {
  case 1:
  case 2:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
    }
    this_00 = (protobuf *)&value;
    bVar1 = ConsumeNumber(this,(double *)this_00,"Expected number.");
    if (!bVar1) goto LAB_001d1cf4;
    SimpleDtoa_abi_cxx11_(&local_60,this_00,value);
    std::__cxx11::string::append((string *)output);
    break;
  case 3:
  case 0x10:
  case 0x12:
    uVar2 = 0x7fffffffffffffff;
    goto LAB_001d1abf;
  case 4:
  case 6:
    uVar2 = 0xffffffffffffffff;
    goto LAB_001d1bc5;
  case 5:
  case 0xf:
  case 0x11:
    uVar2 = 0x7fffffff;
LAB_001d1abf:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::append((char *)output);
      uVar2 = uVar2 + 1;
    }
    bVar1 = ConsumeInteger64(this,uVar2,&value_1,"Expected integer.");
    if (!bVar1) {
LAB_001d1cf4:
      bVar1 = false;
      goto LAB_001d1cf6;
    }
    SimpleItoa_abi_cxx11_(&local_60,(protobuf *)value_1,i);
    std::__cxx11::string::append((string *)output);
    break;
  case 7:
  case 0xd:
    uVar2 = 0xffffffff;
LAB_001d1bc5:
    bVar1 = TryConsume(this,"-");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Unsigned field can\'t have negative default value.",
                 (allocator<char> *)&value_1);
      AddError(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar1 = ConsumeInteger64(this,uVar2,&value_1,"Expected integer.");
    if (bVar1) {
      SimpleItoa_abi_cxx11_(&local_60,(protobuf *)value_1,i_00);
      std::__cxx11::string::append((string *)output);
      break;
    }
    goto LAB_001d1cf4;
  case 8:
    bVar1 = TryConsume(this,"true");
    if ((!bVar1) && (bVar1 = TryConsume(this,"false"), !bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Expected \"true\" or \"false\".",(allocator<char> *)&value_1);
      AddError(this,&local_60);
      goto LAB_001d1b50;
    }
    std::__cxx11::string::assign((char *)output);
    goto switchD_001d1aab_default;
  case 9:
    bVar1 = ConsumeString(this,output,"Expected string.");
    goto LAB_001d1cec;
  case 10:
  case 0xb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Messages can\'t have default values.",
               (allocator<char> *)&value_1);
    AddError(this,&local_60);
LAB_001d1b50:
    std::__cxx11::string::~string((string *)&local_60);
    goto LAB_001d1cf4;
  case 0xc:
    bVar1 = ConsumeString(this,output,"Expected string.");
    if (!bVar1) goto LAB_001d1cf4;
    CEscape(&local_60,output);
    std::__cxx11::string::operator=((string *)output,(string *)&local_60);
    break;
  case 0xe:
    bVar1 = ConsumeIdentifier(this,output,"Expected identifier.");
LAB_001d1cec:
    if (bVar1 != false) goto switchD_001d1aab_default;
    goto LAB_001d1cf4;
  default:
    goto switchD_001d1aab_default;
  }
  std::__cxx11::string::~string((string *)&local_60);
switchD_001d1aab_default:
  bVar1 = true;
LAB_001d1cf6:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseDefaultAssignment(FieldDescriptorProto* field,
                                    const LocationRecorder& field_location) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet.  Assume an enum for now.
    DO(ConsumeIdentifier(default_value, "Expected identifier."));
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64 max_value = kint64max;
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = kint32max;
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64 max_value = kuint64max;
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = kuint32max;
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      DO(ConsumeString(default_value, "Expected string."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value, "Expected identifier."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}